

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4_int8.h
# Opt level: O1

void ncnn::im2col_sgemm_pack1to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int *piVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  void *pvVar16;
  undefined1 *puVar17;
  uint _h;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  undefined1 (*pauVar25) [16];
  long lVar26;
  uint uVar27;
  size_t _elemsize;
  long lVar28;
  ulong *puVar29;
  undefined1 *puVar30;
  undefined1 (*pauVar31) [16];
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  long lVar38;
  uint uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 local_e8 [16];
  long local_c8;
  Mat local_a8;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  Mat *local_40;
  ulong local_38;
  
  iVar14 = cpu_support_x86_avx2();
  if (iVar14 != 0) {
    im2col_sgemm_pack1to4_int8_sse_avx2(bottom_im2col,top_blob,kernel,opt);
    return;
  }
  iVar14 = cpu_support_x86_xop();
  if (iVar14 == 0) {
    uVar1 = bottom_im2col->w;
    uVar27 = bottom_im2col->h;
    uVar21 = (ulong)uVar27;
    uVar2 = bottom_im2col->c;
    lVar38 = (long)(int)uVar2;
    local_50 = (ulong)(uint)top_blob->c;
    local_a8.cstep = 0;
    local_a8.data = (void *)0x0;
    local_a8.refcount._0_4_ = 0;
    local_a8.refcount._4_4_ = 0;
    local_a8.elemsize = 0;
    local_a8.elempack = 0;
    local_a8.allocator = (Allocator *)0x0;
    local_a8.dims = 0;
    local_a8.w = 0;
    local_a8.h = 0;
    local_a8.d = 0;
    local_a8.c = 0;
    uVar39 = uVar1;
    uVar23 = uVar27;
    if (lVar38 < 4) {
      iVar14 = 1;
      _elemsize = 1;
      _h = uVar2;
      if (1 < (int)uVar1) {
        uVar39 = (uVar1 & 1) + (uVar1 >> 1);
        uVar23 = uVar27 * 2;
      }
    }
    else if ((int)uVar1 < 2) {
      iVar14 = 4;
      _elemsize = 4;
      _h = (uVar2 & 3) + (uVar2 >> 2);
    }
    else {
      iVar14 = 4;
      _elemsize = 4;
      uVar39 = (uVar1 & 1) + (uVar1 >> 1);
      uVar23 = uVar27 * 2;
      _h = (uVar2 & 3) + (uVar2 >> 2);
    }
    local_40 = top_blob;
    Mat::create(&local_a8,uVar23,_h,uVar39,_elemsize,iVar14,opt->workspace_allocator);
    local_58 = (ulong)uVar2;
    uVar15 = (ulong)(int)uVar1;
    if (0 < (int)uVar1 >> 1) {
      local_48 = (ulong)(uint)((int)uVar1 >> 1);
      local_c8 = 1;
      lVar26 = 0;
      uVar36 = 0;
      do {
        puVar30 = (undefined1 *)(local_a8.cstep * uVar36 * local_a8.elemsize + (long)local_a8.data);
        if ((int)uVar2 < 4) {
          uVar20 = 0;
        }
        else {
          lVar33 = 3;
          lVar34 = 1;
          lVar35 = 2;
          uVar18 = 0;
          do {
            if (0 < (int)uVar27) {
              pvVar16 = bottom_im2col->data;
              lVar28 = bottom_im2col->cstep * bottom_im2col->elemsize;
              lVar19 = lVar28 * uVar18 + lVar26;
              lVar13 = lVar28 * lVar33 + local_c8;
              lVar24 = lVar28 * lVar34 + lVar26;
              lVar28 = lVar28 * lVar35 + lVar26;
              lVar22 = 0;
              uVar20 = uVar21;
              do {
                *puVar30 = *(undefined1 *)((long)pvVar16 + lVar22 + lVar19);
                puVar30[1] = *(undefined1 *)((long)pvVar16 + lVar22 + lVar24);
                puVar30[2] = *(undefined1 *)((long)pvVar16 + lVar22 + lVar28);
                puVar30[3] = *(undefined1 *)((long)pvVar16 + lVar22 + lVar13 + -1);
                puVar30[4] = *(undefined1 *)((long)pvVar16 + lVar22 + lVar19 + 1);
                puVar30[5] = *(undefined1 *)((long)pvVar16 + lVar22 + lVar24 + 1);
                puVar30[6] = *(undefined1 *)((long)pvVar16 + lVar22 + lVar28 + 1);
                puVar30[7] = *(undefined1 *)((long)pvVar16 + lVar22 + lVar13);
                puVar30 = puVar30 + 8;
                lVar22 = lVar22 + uVar15;
                uVar39 = (int)uVar20 - 1;
                uVar20 = (ulong)uVar39;
              } while (uVar39 != 0);
            }
            uVar20 = uVar18 + 4;
            lVar19 = uVar18 + 7;
            lVar33 = lVar33 + 4;
            lVar34 = lVar34 + 4;
            lVar35 = lVar35 + 4;
            uVar18 = uVar20;
          } while (lVar19 < lVar38);
        }
        if ((int)uVar20 < (int)uVar2) {
          uVar20 = uVar20 & 0xffffffff;
          do {
            if (0 < (int)uVar27) {
              pvVar16 = (void *)(bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 +
                                (long)bottom_im2col->data);
              uVar18 = uVar21;
              do {
                *puVar30 = *(undefined1 *)((long)pvVar16 + lVar26);
                puVar30[1] = *(undefined1 *)((long)pvVar16 + lVar26 + 1);
                puVar30 = puVar30 + 2;
                pvVar16 = (void *)((long)pvVar16 + uVar15);
                uVar39 = (int)uVar18 - 1;
                uVar18 = (ulong)uVar39;
              } while (uVar39 != 0);
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != local_58);
        }
        uVar36 = uVar36 + 1;
        lVar26 = lVar26 + 2;
        local_c8 = local_c8 + 2;
        local_38 = uVar21;
      } while (uVar36 != local_48);
    }
    uVar21 = uVar15 & 0xfffffffffffffffe;
    if ((uint)uVar21 != uVar1) {
      local_c8 = 0;
      uVar36 = uVar21;
      do {
        uVar39 = ((uint)(uVar36 >> 0x1f) & 1) + (int)uVar36;
        puVar30 = (undefined1 *)
                  ((long)(int)(((int)uVar39 >> 1) + ((int)uVar36 - (uVar39 & 0xfffffffe))) *
                   local_a8.cstep * local_a8.elemsize + (long)local_a8.data);
        if ((int)uVar2 < 4) {
          uVar20 = 0;
        }
        else {
          lVar26 = 1;
          lVar33 = 2;
          lVar34 = 3;
          uVar18 = 0;
          do {
            if (0 < (int)uVar27) {
              pvVar16 = bottom_im2col->data;
              lVar28 = bottom_im2col->cstep * bottom_im2col->elemsize;
              lVar19 = (long)pvVar16 + lVar28 * uVar18 + local_c8;
              lVar24 = (long)pvVar16 + lVar28 * lVar26 + local_c8;
              lVar35 = (long)pvVar16 + lVar28 * lVar33 + local_c8;
              lVar28 = (long)pvVar16 + lVar28 * lVar34 + local_c8;
              uVar39 = uVar27;
              do {
                *puVar30 = *(undefined1 *)(lVar19 + uVar21);
                puVar30[1] = *(undefined1 *)(lVar24 + uVar21);
                puVar30[2] = *(undefined1 *)(lVar35 + uVar21);
                puVar30[3] = *(undefined1 *)(lVar28 + uVar21);
                puVar30 = puVar30 + 4;
                lVar19 = lVar19 + uVar15;
                lVar24 = lVar24 + uVar15;
                lVar35 = lVar35 + uVar15;
                lVar28 = lVar28 + uVar15;
                uVar39 = uVar39 - 1;
              } while (uVar39 != 0);
            }
            uVar20 = uVar18 + 4;
            lVar35 = uVar18 + 7;
            lVar26 = lVar26 + 4;
            lVar33 = lVar33 + 4;
            lVar34 = lVar34 + 4;
            uVar18 = uVar20;
          } while (lVar35 < lVar38);
        }
        if ((int)uVar20 < (int)uVar2) {
          uVar20 = uVar20 & 0xffffffff;
          do {
            if (0 < (int)uVar27) {
              puVar17 = (undefined1 *)
                        ((long)bottom_im2col->data +
                        uVar36 + bottom_im2col->cstep * uVar20 * bottom_im2col->elemsize);
              uVar39 = uVar27;
              do {
                *puVar30 = *puVar17;
                puVar30 = puVar30 + 1;
                puVar17 = puVar17 + uVar15;
                uVar39 = uVar39 - 1;
              } while (uVar39 != 0);
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != local_58);
        }
        uVar36 = uVar36 + 1;
        local_c8 = local_c8 + 1;
      } while ((long)uVar36 < (long)uVar15);
    }
    if (0 < (int)local_50) {
      uVar39 = uVar2 + 3;
      if (-1 < (int)uVar2) {
        uVar39 = uVar2;
      }
      iVar14 = ((int)uVar39 >> 2) * uVar27;
      iVar37 = ((int)uVar2 % 4) * uVar27;
      uVar21 = 0;
      do {
        pauVar25 = (undefined1 (*) [16])
                   (local_40->cstep * uVar21 * local_40->elemsize + (long)local_40->data);
        if ((int)uVar1 < 2) {
          uVar36 = 0;
        }
        else {
          uVar20 = 0;
          do {
            puVar29 = (ulong *)((uVar20 >> 1) * local_a8.cstep * local_a8.elemsize +
                               (long)local_a8.data);
            pauVar31 = (undefined1 (*) [16])
                       (kernel->cstep * uVar21 * kernel->elemsize + (long)kernel->data);
            if (iVar14 < 1) {
              auVar43 = ZEXT1664((undefined1  [16])0x0);
              auVar42 = ZEXT1664((undefined1  [16])0x0);
            }
            else {
              local_e8 = (undefined1  [16])0x0;
              auVar47 = ZEXT1664((undefined1  [16])0x0);
              auVar43 = ZEXT1664((undefined1  [16])0x0);
              auVar44 = ZEXT1664((undefined1  [16])0x0);
              auVar46 = ZEXT1664((undefined1  [16])0x0);
              auVar41 = ZEXT816(0) << 0x40;
              auVar42 = ZEXT1664((undefined1  [16])0x0);
              auVar45 = ZEXT1664((undefined1  [16])0x0);
              iVar32 = iVar14;
              do {
                auVar40._8_8_ = 0;
                auVar40._0_8_ = *puVar29;
                auVar4 = vpmovsxbw_avx(auVar40);
                auVar40 = *pauVar31;
                auVar3 = vpcmpgtb_avx((undefined1  [16])0x0,auVar40);
                auVar10 = vpunpcklbw_avx(auVar40,auVar3);
                auVar9 = vpunpckhbw_avx(auVar40,auVar3);
                auVar8 = vpshufd_avx(auVar4,0x44);
                auVar3 = vpmullw_avx(auVar8,auVar10);
                auVar40 = vpmulhw_avx(auVar8,auVar10);
                auVar5 = vpmullw_avx(auVar8,auVar9);
                auVar8 = vpmulhw_avx(auVar8,auVar9);
                auVar4 = vpshufd_avx(auVar4,0xee);
                auVar6 = vpmullw_avx(auVar4,auVar10);
                auVar10 = vpmulhw_avx(auVar4,auVar10);
                auVar7 = vpmullw_avx(auVar4,auVar9);
                auVar9 = vpmulhw_avx(auVar4,auVar9);
                auVar4 = vpunpcklwd_avx(auVar3,auVar40);
                local_e8 = vpaddd_avx(auVar4,local_e8);
                auVar40 = vpunpckhwd_avx(auVar3,auVar40);
                auVar40 = vpaddd_avx(auVar40,auVar43._0_16_);
                auVar43 = ZEXT1664(auVar40);
                auVar3 = vpunpcklwd_avx(auVar5,auVar8);
                auVar3 = vpaddd_avx(auVar3,auVar44._0_16_);
                auVar44 = ZEXT1664(auVar3);
                auVar4 = vpunpckhwd_avx(auVar5,auVar8);
                auVar4 = vpaddd_avx(auVar46._0_16_,auVar4);
                auVar46 = ZEXT1664(auVar4);
                auVar8 = vpunpcklwd_avx(auVar6,auVar10);
                auVar8 = vpaddd_avx(auVar8,auVar47._0_16_);
                auVar47 = ZEXT1664(auVar8);
                auVar10 = vpunpckhwd_avx(auVar6,auVar10);
                auVar41 = vpaddd_avx(auVar41,auVar10);
                auVar10 = vpunpcklwd_avx(auVar7,auVar9);
                auVar10 = vpaddd_avx(auVar42._0_16_,auVar10);
                auVar42 = ZEXT1664(auVar10);
                auVar9 = vpunpckhwd_avx(auVar7,auVar9);
                auVar9 = vpaddd_avx(auVar45._0_16_,auVar9);
                auVar45 = ZEXT1664(auVar9);
                puVar29 = puVar29 + 1;
                pauVar31 = pauVar31 + 1;
                iVar32 = iVar32 + -1;
              } while (iVar32 != 0);
              auVar5 = vpunpckldq_avx(local_e8,auVar40);
              auVar6 = vpunpckldq_avx(auVar3,auVar4);
              auVar40 = vpunpckhdq_avx(local_e8,auVar40);
              auVar3 = vpunpckhdq_avx(auVar3,auVar4);
              auVar7 = vpunpckldq_avx(auVar8,auVar41);
              auVar11 = vpunpckldq_avx(auVar10,auVar9);
              auVar4 = vpunpckhdq_avx(auVar8,auVar41);
              auVar8 = vpunpckhdq_avx(auVar10,auVar9);
              auVar10 = vpunpcklqdq_avx(auVar5,auVar6);
              auVar41 = vpunpckhqdq_avx(auVar5,auVar6);
              auVar41 = vpaddd_avx(auVar10,auVar41);
              auVar10 = vpunpcklqdq_avx(auVar40,auVar3);
              auVar40 = vpunpckhqdq_avx(auVar40,auVar3);
              auVar40 = vpaddd_avx(auVar40,auVar10);
              auVar41 = vpaddd_avx(auVar41,auVar40);
              auVar42 = ZEXT1664(auVar41);
              auVar40 = vpunpcklqdq_avx(auVar7,auVar11);
              auVar41 = vpunpckhqdq_avx(auVar7,auVar11);
              auVar41 = vpaddd_avx(auVar40,auVar41);
              auVar3 = vpunpcklqdq_avx(auVar4,auVar8);
              auVar40 = vpunpckhqdq_avx(auVar4,auVar8);
              auVar40 = vpaddd_avx(auVar40,auVar3);
              auVar41 = vpaddd_avx(auVar41,auVar40);
              auVar43 = ZEXT1664(auVar41);
            }
            auVar40 = auVar43._0_16_;
            auVar41 = auVar42._0_16_;
            if (0 < iVar37) {
              lVar38 = 0;
              do {
                auVar41 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar29 + lVar38 * 2)));
                auVar41 = vpshuflw_avx(auVar41,0x50);
                auVar40 = vpshufd_avx(auVar41,0x50);
                auVar41._8_8_ = 0;
                auVar41._0_8_ = *(ulong *)(*pauVar31 + lVar38 * 4);
                auVar41 = vpmovsxbw_avx(auVar41);
                auVar41 = vpshufd_avx(auVar41,0x44);
                auVar3 = vpmullw_avx(auVar40,auVar41);
                auVar40 = vpmulhw_avx(auVar40,auVar41);
                auVar41 = vpunpcklwd_avx(auVar3,auVar40);
                auVar41 = vpaddd_avx(auVar42._0_16_,auVar41);
                auVar42 = ZEXT1664(auVar41);
                auVar40 = vpunpckhwd_avx(auVar3,auVar40);
                auVar40 = vpaddd_avx(auVar43._0_16_,auVar40);
                auVar43 = ZEXT1664(auVar40);
                lVar38 = lVar38 + 1;
              } while (iVar37 != (int)lVar38);
            }
            *pauVar25 = auVar41;
            pauVar25[1] = auVar40;
            pauVar25 = pauVar25 + 2;
            uVar36 = uVar20 + 2;
            lVar38 = uVar20 + 3;
            uVar20 = uVar36;
          } while (lVar38 < (long)uVar15);
        }
        if ((int)uVar36 < (int)uVar1) {
          do {
            puVar29 = (ulong *)((((uint)uVar36 & 1) + ((uint)(uVar36 >> 1) & 0x7fffffff)) *
                                local_a8.cstep * local_a8.elemsize + (long)local_a8.data);
            pauVar31 = (undefined1 (*) [16])
                       (kernel->cstep * uVar21 * kernel->elemsize + (long)kernel->data);
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            if (0 < iVar14) {
              auVar43 = ZEXT1664((undefined1  [16])0x0);
              auVar44 = ZEXT1664((undefined1  [16])0x0);
              auVar45 = ZEXT1664((undefined1  [16])0x0);
              iVar32 = iVar14;
              do {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = *puVar29;
                auVar3 = vpmovsxbw_avx(auVar3);
                auVar41 = *pauVar31;
                auVar40 = vpcmpgtb_avx((undefined1  [16])0x0,auVar41);
                auVar8 = vpunpcklbw_avx(auVar41,auVar40);
                auVar4 = vpunpckhbw_avx(auVar41,auVar40);
                auVar41 = vpshufd_avx(auVar3,0x44);
                auVar3 = vpmullw_avx(auVar41,auVar8);
                auVar40 = vpmulhw_avx(auVar41,auVar8);
                auVar8 = vpmullw_avx(auVar41,auVar4);
                auVar4 = vpmulhw_avx(auVar41,auVar4);
                auVar41 = vpunpcklwd_avx(auVar3,auVar40);
                auVar41 = vpaddd_avx(auVar45._0_16_,auVar41);
                auVar45 = ZEXT1664(auVar41);
                auVar40 = vpunpckhwd_avx(auVar3,auVar40);
                auVar40 = vpaddd_avx(auVar44._0_16_,auVar40);
                auVar44 = ZEXT1664(auVar40);
                auVar3 = vpunpcklwd_avx(auVar8,auVar4);
                auVar3 = vpaddd_avx(auVar43._0_16_,auVar3);
                auVar43 = ZEXT1664(auVar3);
                auVar4 = vpunpckhwd_avx(auVar8,auVar4);
                auVar4 = vpaddd_avx(auVar42._0_16_,auVar4);
                auVar42 = ZEXT1664(auVar4);
                puVar29 = (ulong *)((long)puVar29 + 4);
                pauVar31 = pauVar31 + 1;
                iVar32 = iVar32 + -1;
              } while (iVar32 != 0);
              auVar8 = vpunpckldq_avx(auVar41,auVar40);
              auVar10 = vpunpckldq_avx(auVar3,auVar4);
              auVar40 = vpunpckhdq_avx(auVar41,auVar40);
              auVar3 = vpunpckhdq_avx(auVar3,auVar4);
              auVar4 = vpunpcklqdq_avx(auVar8,auVar10);
              auVar41 = vpunpckhqdq_avx(auVar8,auVar10);
              auVar41 = vpaddd_avx(auVar4,auVar41);
              auVar4 = vpunpcklqdq_avx(auVar40,auVar3);
              auVar40 = vpunpckhqdq_avx(auVar40,auVar3);
              auVar40 = vpaddd_avx(auVar40,auVar4);
              auVar41 = vpaddd_avx(auVar41,auVar40);
              auVar42 = ZEXT1664(auVar41);
            }
            auVar41 = auVar42._0_16_;
            if (0 < iVar37) {
              lVar38 = 0;
              do {
                auVar41 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar29 + lVar38)),0);
                auVar3 = vpshufd_avx(auVar41,0);
                auVar4._8_8_ = 0;
                auVar4._0_8_ = *(ulong *)(*pauVar31 + lVar38 * 4);
                auVar41 = vpmovsxbw_avx(auVar4);
                auVar40 = vpmullw_avx(auVar3,auVar41);
                auVar41 = vpmulhw_avx(auVar3,auVar41);
                auVar41 = vpunpcklwd_avx(auVar40,auVar41);
                auVar41 = vpaddd_avx(auVar42._0_16_,auVar41);
                auVar42 = ZEXT1664(auVar41);
                lVar38 = lVar38 + 1;
              } while (iVar37 != (int)lVar38);
            }
            *pauVar25 = auVar41;
            pauVar25 = pauVar25 + 1;
            uVar27 = (uint)uVar36 + 1;
            uVar36 = (ulong)uVar27;
          } while (uVar27 != uVar1);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != local_50);
    }
    piVar12 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          if (local_a8.data != (void *)0x0) {
            free(local_a8.data);
          }
        }
        else {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_pack1to4_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_pack1to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack1to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack1to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
                __m256i _sum21_33 = _mm256_setzero_si256();
                __m256i _sum31_23 = _mm256_setzero_si256();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                    __m256i _sl20_31 = _mm256_mullo_epi16(_val23_16, _w01_16);
                    __m256i _sh20_31 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                    __m256i _sl30_21 = _mm256_mullo_epi16(_val32_16, _w01_16);
                    __m256i _sh30_21 = _mm256_mulhi_epi16(_val32_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_unpacklo_epi16(_sl20_31, _sh20_31));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_unpacklo_epi16(_sl30_21, _sh30_21));
                    _sum21_33 = _mm256_add_epi32(_sum21_33, _mm256_unpackhi_epi16(_sl20_31, _sh20_31));
                    _sum31_23 = _mm256_add_epi32(_sum31_23, _mm256_unpackhi_epi16(_sl30_21, _sh30_21));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum20_32, _sum30_22);
                    _tmp1 = _mm256_unpacklo_epi32(_sum21_33, _sum31_23);
                    _tmp2 = _mm256_unpackhi_epi32(_sum20_32, _sum30_22);
                    _tmp3 = _mm256_unpackhi_epi32(_sum21_33, _sum31_23);
                    _sum20_32 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum30_22 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum21_33 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum31_23 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum30_22);
                _sum21_33 = _mm256_add_epi32(_sum21_33, _sum31_23);
                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum21_33);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
                _sum20_32 = _mm256_permutevar8x32_epi32(_sum20_32, _perm_mask);
#endif
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val01 = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);
                __m128i _val23 = _mm_set_epi16(tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[2], tmpptr[2], tmpptr[2], tmpptr[2]);

                __m128i _w0123 = _mm_set_epi16(kptr0[3], kptr0[2], kptr0[1], kptr0[0], kptr0[3], kptr0[2], kptr0[1], kptr0[0]);

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            _mm_storeu_si128((__m128i*)(outptr0 + 8), _sum20);
            _mm_storeu_si128((__m128i*)(outptr0 + 12), _sum30);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
#endif
#else
#if __XOP__
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum02 = _mm_setzero_si128();
                __m128i _sum03 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
                __m128i _sum12 = _mm_setzero_si128();
                __m128i _sum13 = _mm_setzero_si128();
#endif
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                    __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                    __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                    __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                    __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);

                    _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl01, _sh01));
                    _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                    _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl10, _sh10));
                    _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl11, _sh11));
                    _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl11, _sh11));
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
#endif
#else
#if __XOP__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                    _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                    _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                    _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                    _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                    _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                    _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                    _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                    _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum02 = _mm_add_epi32(_sum02, _sum03);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
                _sum12 = _mm_add_epi32(_sum12, _sum13);

                _sum00 = _mm_add_epi32(_sum00, _sum02);
                _sum10 = _mm_add_epi32(_sum10, _sum12);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}